

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O3

void __thiscall Am_Text_Fragment::Break_At(Am_Text_Fragment *this,Am_Text_Index inRelIndex)

{
  ulong uVar1;
  Am_Text_Fragment *pAVar2;
  Am_Text_Fragment *this_00;
  
  uVar1 = this->mStrLen;
  if (inRelIndex <= uVar1) {
    this_00 = (Am_Text_Fragment *)operator_new(0x438);
    Am_Text_Fragment(this_00,this->mTextObject,this->mString + (inRelIndex - 1),
                     (uVar1 - inRelIndex) + 1);
    this->mStrLen = inRelIndex - 1;
    pAVar2 = this->mNext;
    this_00->mNext = pAVar2;
    if (pAVar2 != (Am_Text_Fragment *)0x0) {
      pAVar2->mPrev = this_00;
    }
    this->mNext = this_00;
    this_00->mPrev = this;
  }
  return;
}

Assistant:

void
Am_Text_Fragment::Break_At(Am_Text_Index inRelIndex) // first char in next frag
{
  if (inRelIndex > mStrLen)
    return;

  Am_Text_Fragment *new_frag = new Am_Text_Fragment(
      mTextObject, (char *)mString + inRelIndex - 1, mStrLen - inRelIndex + 1);
  mStrLen = inRelIndex - 1;

  new_frag->mNext = this->mNext;
  if (this->mNext != nullptr)
    this->mNext->mPrev = new_frag;

  this->mNext = new_frag;
  new_frag->mPrev = this;
}